

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall
caffe::BatchNormParameter::BatchNormParameter(BatchNormParameter *this,BatchNormParameter *from)

{
  void *pvVar1;
  undefined3 uVar2;
  float fVar3;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__BatchNormParameter_0071cf00;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->eps_ = from->eps_;
  uVar2 = *(undefined3 *)&from->field_0x19;
  fVar3 = from->moving_average_fraction_;
  this->use_global_stats_ = from->use_global_stats_;
  *(undefined3 *)&this->field_0x19 = uVar2;
  this->moving_average_fraction_ = fVar3;
  return;
}

Assistant:

BatchNormParameter::BatchNormParameter(const BatchNormParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&use_global_stats_, &from.use_global_stats_,
    reinterpret_cast<char*>(&eps_) -
    reinterpret_cast<char*>(&use_global_stats_) + sizeof(eps_));
  // @@protoc_insertion_point(copy_constructor:caffe.BatchNormParameter)
}